

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sc_event.cpp
# Opt level: O2

void * sc_core::sc_event_timed::allocate(void)

{
  undefined8 *puVar1;
  undefined8 *puVar2;
  long lVar3;
  bool bVar4;
  
  puVar2 = free_list;
  if (free_list == (undefined8 *)0x0) {
    puVar2 = (undefined8 *)malloc(0x400);
    lVar3 = 0x3f;
    puVar1 = puVar2;
    while( true ) {
      bVar4 = lVar3 == 0;
      lVar3 = lVar3 + -1;
      if (bVar4) break;
      *puVar1 = puVar1 + 2;
      puVar1 = puVar1 + 2;
    }
    puVar2[0x7e] = 0;
  }
  free_list = (undefined8 *)*puVar2;
  return puVar2;
}

Assistant:

void*
sc_event_timed::allocate()
{
    const int ALLOC_SIZE = 64;

    if( free_list == 0 ) {
        free_list = (sc_event_timed_u*) malloc( ALLOC_SIZE *
                                                sizeof( sc_event_timed_u ) );
        int i = 0;
        for( ; i < ALLOC_SIZE - 1; ++ i ) {
            free_list[i].next = &free_list[i + 1];
        }
        free_list[i].next = 0;
    }

    sc_event_timed_u* q = free_list;
    free_list = free_list->next;
    return q;
}